

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O1

void __thiscall
chrono::fea::ShellANCF_Force::Evaluate
          (ShellANCF_Force *this,ChVectorN<double,_54> *result,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ChVectorN<double,_5> *pCVar40;
  ChElementShellANCF_3423 *pCVar41;
  pointer pLVar42;
  element_type *peVar43;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar44;
  double dVar45;
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  bool bVar64;
  int iVar65;
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  ChVectorN<double,_54> *__dest;
  ShellANCF_Force *pSVar70;
  double *pdVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  Index row_1;
  undefined1 *puVar75;
  ChMatrixNM<double,_6,_6> *pCVar76;
  Index col;
  long lVar77;
  uint uVar78;
  LhsNested actual_lhs_1;
  double *pdVar79;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  long lVar80;
  uint uVar81;
  Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *rhs;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar101 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar102 [32];
  undefined1 auVar109 [64];
  undefined1 auVar103 [32];
  undefined1 auVar110 [64];
  undefined1 auVar104 [32];
  undefined1 auVar111 [64];
  undefined1 auVar105 [32];
  undefined1 auVar112 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar106 [32];
  undefined1 auVar113 [64];
  double dVar114;
  double dVar115;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  double dVar139;
  undefined1 auVar138 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  ChVectorN<double,_6> strain;
  ChMatrixNM<double,_1,_3> tempB3;
  ChMatrixNM<double,_1,_4> S_ANS;
  ShapeVector Ny;
  ShapeVector Nx;
  ShapeVector N;
  ChMatrixNM<double,_1,_3> Nz_d0;
  ChVectorN<double,_5> HE;
  ChMatrixNM<double,_1,_3> tempB31;
  ChVectorN<double,_6> strain_EAS;
  ChMatrixNM<double,_6,_5> M;
  ChMatrixNM<double,_1,_3> Ny_d0;
  ChMatrixNM<double,_1,_3> Nx_d0;
  ChMatrixNM<double,_6,_5> G;
  ChVectorN<double,_24> Fint;
  ChVectorN<double,_8> ddNy;
  ChVectorN<double,_8> ddNx;
  ChMatrixNM<double,_5,_5> KALPHA;
  ChMatrixNM<double,_5,_6> temp56;
  ChMatrixNM<double,_6,_24> strainD;
  ChMatrixNM<double,_6,_24> strainD_til;
  ChVectorN<double,_8> d0d0Ny;
  ChVectorN<double,_8> d0d0Nx;
  ShapeVector Nz;
  assign_op<double,_double> local_18c9;
  double local_18c8;
  undefined1 local_18c0 [16];
  undefined1 local_18b0 [16];
  ChVectorN<double,_54> *local_1898;
  ShellANCF_Force *local_1890;
  double local_1888;
  double local_1880;
  double local_1878;
  double local_1870;
  undefined8 uStack_1868;
  undefined1 local_1860 [16];
  double local_1850;
  double dStack_1848;
  double local_1840;
  double dStack_1838;
  double local_1830;
  double dStack_1828;
  ulong local_1820;
  undefined8 uStack_1818;
  undefined1 local_1810 [16];
  undefined1 local_1800 [16];
  undefined1 local_17f0 [16];
  undefined1 local_17e0 [16];
  double local_17d0;
  ulong local_17c0;
  double local_17b8;
  undefined8 local_17b0;
  double local_17a8;
  double local_17a0;
  undefined8 uStack_1798;
  undefined1 local_1790 [16];
  undefined1 local_1780 [24];
  double local_1768;
  double local_1760;
  double local_1758;
  double local_1750;
  double local_1748;
  ShapeVector local_1740;
  ShapeVector local_1700;
  double local_16c0 [10];
  double local_1670;
  undefined8 uStack_1668;
  ChMatrixNM<double,_1,_3> local_1658;
  undefined1 local_1640 [16];
  assign_op<double,_double> *paStack_1630;
  DstXprType *pDStack_1628;
  undefined8 uStack_1620;
  ulong uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined1 local_1600 [64];
  undefined1 local_15c0 [64];
  undefined1 local_1580 [16];
  double local_1570;
  undefined8 uStack_1568;
  double local_1560;
  undefined8 uStack_1558;
  undefined1 local_1550 [16];
  double local_1540;
  double dStack_1538;
  double local_1530;
  double dStack_1528;
  double local_1520;
  undefined1 local_1510 [16];
  double local_1500;
  double local_14f0 [6];
  double local_14c0 [6];
  ulong uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  double adStack_1470 [3];
  ulong uStack_1458;
  undefined8 uStack_1450;
  double adStack_1448 [5];
  double adStack_1420 [16];
  ChMatrixNM<double,_1,_3> local_13a0;
  ChMatrixNM<double,_1,_3> local_1388;
  DstXprType local_1370;
  undefined1 local_1280 [64];
  undefined1 local_1240 [64];
  undefined1 local_1200 [64];
  Matrix<double,_8,_1,_0,_8,_1> local_11c0;
  Matrix<double,_8,_1,_0,_8,_1> local_1180;
  undefined1 local_1140 [192];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 auStack_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [16];
  double dStack_f70;
  undefined1 auStack_f68 [40];
  double local_f40;
  undefined1 auStack_f38 [40];
  double dStack_f10;
  undefined8 uStack_f08;
  undefined1 local_f00 [64];
  undefined1 local_ec0 [16];
  double dStack_eb0;
  undefined1 auStack_ea8 [40];
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  undefined1 local_e00 [64];
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d40 [64];
  undefined1 local_d00 [64];
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  double *local_b40;
  Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *local_b38;
  double *local_b30;
  undefined8 local_b28;
  plainobjectbase_evaluator_data<double,_5> local_b00;
  undefined1 auStack_af8 [56];
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_5,_0,_6,_5>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_680;
  undefined8 uStack_660;
  ulong uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  ulong local_5c0 [24];
  ulong local_500 [24];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_5,_6,_1,_5,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_5,_5,_0,_5,_5>_>_>
  local_1e8;
  Matrix<double,_8,_1,_0,_8,_1> local_1c0;
  Matrix<double,_8,_1,_0,_8,_1> local_180;
  ShapeVector local_140 [4];
  
  local_1790._8_8_ = local_1790._0_8_;
  local_1860._8_8_ = local_1860._0_8_;
  uStack_1868 = local_1870;
  local_1780._8_8_ = local_1780._0_8_;
  local_16c0[6] = (1.0 - x) * 0.25;
  local_16c0[3] = 1.0 - y;
  local_16c0[0] = local_16c0[6] * local_16c0[3];
  local_18b0._8_8_ = local_18b0._0_8_;
  local_18b0._0_8_ = z;
  local_16c0[5] = z * this->m_element->m_thickness * 0.5 * 0.25;
  auVar92._0_8_ = (1.0 - x) * local_16c0[5];
  local_16c0[1] = local_16c0[3] * auVar92._0_8_;
  local_16c0[4] = (x + 1.0) * 0.25;
  local_16c0[2] = local_16c0[4] * local_16c0[3];
  local_16c0[5] = (x + 1.0) * local_16c0[5];
  local_16c0[3] = local_16c0[3] * local_16c0[5];
  local_18c0._8_8_ = local_18c0._0_8_;
  local_18c0._0_8_ = y;
  local_16c0[7] = y + 1.0;
  local_16c0[4] = local_16c0[4] * local_16c0[7];
  local_16c0[5] = local_16c0[7] * local_16c0[5];
  local_16c0[6] = local_16c0[6] * local_16c0[7];
  local_16c0[7] = local_16c0[7] * auVar92._0_8_;
  local_1890 = this;
  local_1670 = ChElementShellANCF_3423::Calc_detJ0
                         (this->m_element,x,y,z,&local_1700,&local_1740,local_140,&local_1388,
                          &local_13a0,&local_1658);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = x;
  auVar82 = ZEXT816(0x3fe0000000000000);
  auVar88 = vfmadd213sd_fma(ZEXT816(0xbfe0000000000000),auVar84,auVar82);
  local_17c0 = auVar88._0_8_;
  auVar88 = vfmadd213sd_fma(auVar82,auVar84,auVar82);
  local_17b8 = auVar88._0_8_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_18c0._0_8_;
  auVar88 = vfmadd213sd_fma(ZEXT816(0xbfe0000000000000),auVar83,auVar82);
  local_17b0 = auVar88._0_8_;
  local_1780._0_8_ = local_17b0;
  auVar88 = vfmadd213sd_fma(auVar82,auVar83,auVar82);
  local_17a8 = auVar88._0_8_;
  local_14c0[1] = 0.0;
  local_14c0[2] = 0.0;
  local_14c0[3] = 0.0;
  local_14c0[4] = 0.0;
  local_14c0[5] = 0.0;
  uStack_1488 = 0;
  local_1480 = 0;
  uStack_1478 = 0;
  adStack_1470[0] = 0.0;
  adStack_1470[1] = 0.0;
  uStack_1450 = 0;
  adStack_1448[0] = 0.0;
  adStack_1448[1] = 0.0;
  adStack_1448[2] = 0.0;
  adStack_1448[3] = 0.0;
  adStack_1420[0] = 0.0;
  adStack_1420[1] = 0.0;
  adStack_1420[2] = 0.0;
  adStack_1420[3] = 0.0;
  adStack_1420[4] = 0.0;
  adStack_1420[5] = 0.0;
  adStack_1420[6] = 0.0;
  adStack_1420[7] = 0.0;
  adStack_1420[8] = 0.0;
  adStack_1420[9] = 0.0;
  uStack_1490 = local_18c0._0_8_;
  uStack_1458 = local_18c0._0_8_;
  adStack_1448[4] = (double)local_18b0._0_8_;
  auVar91._8_8_ = 0;
  auVar91._0_8_ =
       local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  local_1800._8_8_ = 0;
  local_1800._0_8_ =
       local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar89._8_8_ = 0;
  auVar89._0_8_ =
       local_13a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_1810._8_8_ = 0;
  local_1810._0_8_ =
       local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_1550._8_8_ = 0;
  local_1550._0_8_ =
       local_13a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       local_13a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  local_17a0 = -local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[2];
  uStack_1798 = 0x8000000000000000;
  auVar85._8_8_ = 0;
  auVar85._0_8_ =
       local_13a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] *
       local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_18b0 = vfmsub231sd_fma(auVar85,local_1800,auVar89);
  local_1758 = local_13a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[2];
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       local_13a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2] *
       local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  local_18c0 = vfmsub231sd_fma(auVar86,local_1810,local_1550);
  local_1820 = 0x8000000000000000;
  uStack_1818 = 0x8000000000000000;
  local_1560 = -local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[1];
  uStack_1558 = 0x8000000000000000;
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       local_13a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0] *
       local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar82 = vfmsub231sd_fma(auVar87,auVar91,auVar82);
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] *
       local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar88 = vfmadd231sd_fma(auVar88,auVar91,auVar91);
  auVar88 = vfmadd231sd_fma(auVar88,local_1810,local_1810);
  local_1870 = local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[0];
  local_1878 = local_13a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[1];
  auVar92._0_8_ = auVar82._0_8_;
  local_1748 = local_17a8;
  uStack_1668 = extraout_XMM0_Qb;
  local_14c0[0] = x;
  adStack_1470[2] = x;
  if (auVar88._0_8_ < 0.0) {
    local_18c8 = sqrt(auVar88._0_8_);
    auVar92._8_8_ = 0;
    auVar82 = auVar92;
    local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
    [0] = local_1870;
  }
  else {
    auVar88 = vsqrtsd_avx(auVar88,auVar88);
    local_18c8 = auVar88._0_8_;
  }
  pSVar70 = local_1890;
  local_18c8 = 1.0 / local_18c8;
  dVar139 = local_1388.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
            .array[0] * local_18c8;
  dVar44 = local_18c8 * (double)local_1800._0_8_;
  local_18c8 = local_18c8 * (double)local_1810._0_8_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = (double)local_18c0._0_8_ * (double)local_18c0._0_8_;
  auVar88 = vfmadd231sd_fma(auVar90,local_18b0,local_18b0);
  auVar88 = vfmadd231sd_fma(auVar88,auVar82,auVar82);
  if (auVar88._0_8_ < 0.0) {
    dVar114 = sqrt(auVar88._0_8_);
  }
  else {
    auVar88 = vsqrtsd_avx(auVar88,auVar88);
    dVar114 = auVar88._0_8_;
    auVar92._0_8_ = auVar82._0_8_;
  }
  bVar64 = 2.2250738585072014e-308 <= dVar114;
  dVar114 = 1.0 / dVar114;
  local_1570 = (double)((ulong)bVar64 * (long)(dVar114 * (double)local_18b0._0_8_) +
                       (ulong)!bVar64 * 0x3ff0000000000000);
  uStack_1568 = 0;
  uVar74 = (ulong)bVar64 * (long)(dVar114 * (double)local_18c0._0_8_);
  local_1580._8_8_ = 0;
  local_1580._0_8_ = uVar74;
  auVar92._0_8_ = (double)((ulong)bVar64 * (long)(auVar92._0_8_ * dVar114));
  local_17f0._8_8_ = 0;
  local_17f0._0_8_ = auVar92._0_8_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = local_18c8;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = auVar92._0_8_ * dVar44;
  auVar88 = vfmsub231sd_fma(auVar100,local_1580,auVar95);
  local_1898 = auVar88._0_8_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar139;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = local_18c8 * local_1570;
  auVar88 = vfmsub231sd_fma(auVar96,auVar98,local_17f0);
  local_1860._0_8_ = auVar88._0_8_;
  local_1790._0_8_ = dVar139 * (double)(uVar74 ^ local_1820);
  auVar92._0_8_ =
       (pSVar70->m_element->m_layers).
       super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
       ._M_impl.super__Vector_impl_data._M_start[pSVar70->m_kl].m_theta;
  local_1750 = cos(auVar92._0_8_);
  local_1880 = local_1750 * dVar139;
  local_1888 = local_1750 * dVar44;
  dVar114 = sin(auVar92._0_8_);
  local_1760 = dVar114 * (double)local_1898 + local_1880;
  local_1888 = dVar114 * (double)local_1860._0_8_ + local_1888;
  local_1880 = dVar114;
  local_1768 = sin(auVar92._0_8_);
  dVar115 = cos(auVar92._0_8_);
  dVar114 = dVar115 * (double)local_1898 - local_1768 * dVar139;
  dVar45 = dVar115 * (double)local_1860._0_8_ - local_1768 * dVar44;
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       local_1658.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar99._8_8_ = 0;
  auVar99._0_8_ =
       local_1658.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar143._8_8_ = 0;
  auVar143._0_8_ =
       local_1658.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar166._8_8_ = 0;
  auVar166._0_8_ = local_1758;
  auVar146._8_8_ = 0;
  auVar146._0_8_ =
       local_1758 *
       local_1658.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar224._8_8_ = 0;
  auVar224._0_8_ = local_1878;
  auVar82 = vfmsub231sd_avx512f(auVar146,auVar224,auVar97);
  auVar153._8_8_ = 0;
  auVar153._0_8_ =
       local_1550._0_8_ *
       local_1658.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar88 = vfmsub231sd_fma(auVar153,auVar99,auVar166);
  auVar88 = vunpcklpd_avx(auVar82,auVar88);
  auVar82 = vmulsd_avx512f(auVar224,auVar99);
  auVar84 = vfmsub231sd_fma(auVar82,auVar143,local_1550);
  auVar159._8_8_ = 0;
  auVar159._0_8_ =
       local_1658.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2] * local_1560;
  auVar82 = vfmadd213sd_fma(local_1810,auVar143,auVar159);
  auVar82 = vunpcklpd_avx(auVar84,auVar82);
  auVar160._8_8_ = 0;
  auVar160._0_8_ =
       local_1658.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0] * local_17a0;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = local_1870;
  auVar83 = vfmadd231sd_avx512f(auVar160,auVar219,auVar97);
  auVar84 = vmulsd_avx512f(auVar219,auVar143);
  auVar84 = vfmsub231sd_fma(auVar84,local_1800,auVar99);
  auVar84 = vunpcklpd_avx(auVar83,auVar84);
  auVar83 = vunpcklpd_avx(local_18b0,local_18c0);
  auVar93._8_8_ = uStack_1668;
  auVar93._0_8_ = local_1670;
  auVar151._8_8_ = local_1670;
  auVar151._0_8_ = local_1670;
  auVar88 = vdivpd_avx(auVar88,auVar151);
  local_1860 = vdivpd_avx512vl(auVar82,auVar151);
  auVar82 = vdivpd_avx(auVar84,auVar151);
  auVar84 = vdivpd_avx(auVar83,auVar151);
  auVar85 = vshufpd_avx512vl(local_1860,local_1860,1);
  auVar83 = vshufpd_avx(auVar88,auVar88,1);
  auVar91 = vshufpd_avx(auVar84,auVar84,1);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = local_1888;
  auVar86 = vmulsd_avx512f(auVar176,auVar83);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = local_1760;
  auVar86 = vfmadd231sd_avx512f(auVar86,auVar172,auVar88);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = dVar45;
  auVar87 = vmulsd_avx512f(auVar140,auVar83);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = dVar114;
  auVar87 = vfmadd231sd_avx512f(auVar87,auVar133,auVar88);
  auVar83 = vmulsd_avx512f(local_1580,auVar83);
  auVar94._8_8_ = uStack_1568;
  auVar94._0_8_ = local_1570;
  auVar83 = vfmadd231sd_avx512f(auVar83,auVar94,auVar88);
  auVar88 = vmulsd_avx512f(auVar176,auVar82);
  auVar89 = vfmadd231sd_avx512f(auVar88,auVar172,auVar85);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = dVar45 * auVar82._0_8_;
  auVar88 = vfmadd231sd_fma(auVar147,auVar133,auVar85);
  local_17a0 = auVar88._0_8_;
  auVar88 = vmulsd_avx512f(local_1580,auVar82);
  auVar88 = vfmadd231sd_avx512f(auVar88,auVar94,auVar85);
  auVar85 = vmulsd_avx512f(auVar91,auVar176);
  auVar85 = vfmadd231sd_avx512f(auVar85,auVar84,auVar172);
  auVar90 = vmulsd_avx512f(auVar91,auVar140);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = dVar114;
  auVar90 = vfmadd231sd_avx512f(auVar90,auVar84,auVar134);
  auVar91 = vmulsd_avx512f(local_1580,auVar91);
  auVar84 = vfmadd231sd_avx512f(auVar91,auVar84,auVar94);
  pdVar71 = (double *)
            ((long)&(pSVar70->m_element->m_layers).
                    super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
                    ._M_impl.super__Vector_impl_data._M_start[pSVar70->m_kl].m_T0.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage + 0x28);
  dStack_eb0 = pdVar71[-8];
  puVar75 = local_fc0 + 0x20;
  local_fc0._16_8_ = puVar75;
  lVar77 = 0;
  do {
    dVar114 = local_14c0[lVar77];
    dVar45 = local_14c0[lVar77 + 5];
    dVar1 = adStack_1470[lVar77];
    dVar2 = adStack_1448[lVar77];
    dVar3 = adStack_1420[lVar77];
    dVar4 = adStack_1420[lVar77 + 5];
    lVar80 = 0;
    pdVar79 = pdVar71;
    do {
      *(double *)(puVar75 + lVar80 * 8) =
           dVar114 * ((plain_array<double,_36,_1,_32> *)(pdVar79 + -5))->array[0] +
           dVar45 * pdVar79[-4] + dVar1 * pdVar79[-3] +
           dVar2 * pdVar79[-2] + dVar3 * pdVar79[-1] + dVar4 * *pdVar79;
      lVar80 = lVar80 + 1;
      pdVar79 = pdVar79 + 6;
    } while (lVar80 != 6);
    lVar77 = lVar77 + 1;
    puVar75 = puVar75 + 0x30;
  } while (lVar77 != 5);
  vmovsd_avx512f(auVar84);
  vmovsd_avx512f(auVar85);
  vmovsd_avx512f(auVar83);
  vmovsd_avx512f(auVar86);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = dVar44;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_1790._0_8_;
  auVar84 = vfmadd213sd_avx512f(auVar148,auVar94,auVar6);
  dVar44 = local_1750 * local_18c8 + auVar84._0_8_ * local_1880;
  dVar114 = auVar84._0_8_ * dVar115 - local_1768 * local_18c8;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = local_1800._0_8_ * (double)((ulong)local_1550._0_8_ ^ local_1820);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = local_1870;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = local_1878;
  auVar84 = vfmadd213sd_avx512f(auVar225,auVar220,auVar128);
  auVar84 = vdivsd_avx512f(auVar84,auVar93);
  local_1790 = vshufpd_avx(auVar82,auVar82,1);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = dVar114;
  auVar82 = vfmadd231sd_avx512f(auVar87,auVar116,local_1860);
  vmovsd_avx512f(auVar82);
  local_1870 = dVar44;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = dVar44;
  auVar82 = vfmadd231sd_avx512f(auVar89,auVar141,local_1790);
  vmovsd_avx512f(auVar82);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_17f0._0_8_;
  auVar88 = vfmadd231sd_avx512f(auVar88,local_1790,auVar7);
  vmovsd_avx512f(auVar88);
  local_1878 = auVar84._0_8_;
  auVar88 = vfmadd231sd_avx512f(auVar90,auVar116,auVar84);
  vmovsd_avx512f(auVar88);
  dStack_eb0 = dStack_eb0 / local_1670;
  local_680.m_src = (SrcEvaluatorType *)local_fc0;
  local_b00.data = (double *)&local_1370;
  local_680.m_dst = (DstEvaluatorType *)&local_b00;
  local_680.m_functor = (assign_op<double,_double> *)local_1140;
  local_1370.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[0]
       = dStack_eb0 * (double)local_fc0._32_8_;
  local_1370.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[1]
       = dStack_eb0 * dStack_f70;
  local_1370.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[2]
       = dStack_eb0 * local_f40;
  local_1370.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[3]
       = dStack_eb0 * dStack_f10;
  local_1898 = result;
  local_680.m_dstExpr = (DstXprType *)local_b00.data;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_5,_0,_6,_5>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_30>
  ::run(&local_680);
  pCVar40 = pSVar70->m_alpha_eas;
  dVar45 = (pCVar40->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
           array[0];
  dVar115 = (pCVar40->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data
            .array[1];
  dVar1 = (pCVar40->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
          array[2];
  dVar2 = (pCVar40->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
          array[3];
  dVar44 = (pCVar40->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
           array[4];
  pdVar71 = local_1370.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data
            .array + 4;
  lVar77 = 0;
  do {
    local_14f0[lVar77] =
         dVar44 * *pdVar71 +
         dVar45 * ((plain_array<double,_30,_1,_16> *)(pdVar71 + -4))->array[0] + dVar1 * pdVar71[-2]
         + dVar115 * pdVar71[-3] + dVar2 * pdVar71[-1];
    lVar77 = lVar77 + 1;
    pdVar71 = pdVar71 + 5;
  } while (lVar77 != 6);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = local_18b0._0_8_;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = local_1870;
  auVar88 = vfmadd231sd_fma(auVar117,auVar130,local_1860);
  local_18b0._0_8_ = auVar88._0_8_;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = local_18c0._0_8_;
  auVar88 = vfmadd231sd_fma(auVar123,local_17f0,local_1860);
  local_18c0._0_8_ = auVar88._0_8_;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = dVar114;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_17a0;
  auVar88 = vfmadd213sd_fma(auVar124,local_1790,auVar8);
  uVar74 = auVar88._0_8_;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = dVar139;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = local_1878;
  auVar88 = vfmadd231sd_fma(auVar125,auVar129,auVar130);
  uVar73 = auVar88._0_8_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = auVar92._0_8_;
  auVar88 = vfmadd231sd_fma(auVar126,local_17f0,auVar129);
  uVar72 = auVar88._0_8_;
  local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  local_680.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
  local_fc0._0_8_ = &local_1700;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&pSVar70->m_element->m_ddT,
             (Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_fc0,&local_1180,
             (Scalar *)&local_680);
  local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  local_680.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
  local_fc0._0_8_ = &local_1740;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&pSVar70->m_element->m_ddT,
             (Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_fc0,&local_11c0,
             (Scalar *)&local_680);
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4] =
       0.0;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5] =
       0.0;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6] =
       0.0;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7] =
       0.0;
  local_680.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
  local_fc0._0_8_ = &local_1700;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&local_1890->m_element->m_d0d0T,
             (Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_fc0,&local_180,
             (Scalar *)&local_680);
  pSVar70 = local_1890;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7] =
       0.0;
  local_680.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
  local_fc0._0_8_ = &local_1740;
  rhs = (Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_fc0;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&local_1890->m_element->m_d0d0T,rhs,&local_1c0,(Scalar *)&local_680);
  __dest = local_1898;
  auVar112._8_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar112._0_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar112._16_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar112._24_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar112._32_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar112._40_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar112._48_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar112._56_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar107._8_8_ =
       local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1];
  auVar107._0_8_ =
       local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0];
  auVar107._16_8_ =
       local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2];
  auVar107._24_8_ =
       local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3];
  auVar107._32_8_ =
       local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4];
  auVar107._40_8_ =
       local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5];
  auVar107._48_8_ =
       local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6];
  auVar107._56_8_ =
       local_1180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7];
  auVar107 = vmulpd_avx512f(auVar112,auVar107);
  auVar101 = vextractf64x4_avx512f(auVar107,1);
  auVar108._8_8_ =
       local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1];
  auVar108._0_8_ =
       local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0];
  auVar108._16_8_ =
       local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [2];
  auVar108._24_8_ =
       local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [3];
  auVar108._32_8_ =
       local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4];
  auVar108._40_8_ =
       local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  auVar108._48_8_ =
       local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  auVar108._56_8_ =
       local_180.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [7];
  auVar108 = vmulpd_avx512f(auVar112,auVar108);
  auVar102 = vextractf64x4_avx512f(auVar108,1);
  auVar110._8_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar110._0_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar110._16_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar110._24_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar110._32_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar110._40_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar110._48_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar110._56_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar111._8_8_ =
       local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1];
  auVar111._0_8_ =
       local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0];
  auVar111._16_8_ =
       local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2];
  auVar111._24_8_ =
       local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3];
  auVar111._32_8_ =
       local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4];
  auVar111._40_8_ =
       local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5];
  auVar111._48_8_ =
       local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6];
  auVar111._56_8_ =
       local_11c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7];
  auVar109 = vmulpd_avx512f(auVar110,auVar111);
  auVar103 = vextractf64x4_avx512f(auVar109,1);
  auVar113._8_8_ =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1];
  auVar113._0_8_ =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0];
  auVar113._16_8_ =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [2];
  auVar113._24_8_ =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [3];
  auVar113._32_8_ =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4];
  auVar113._40_8_ =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  auVar113._48_8_ =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  auVar113._56_8_ =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [7];
  auVar110 = vmulpd_avx512f(auVar110,auVar113);
  auVar104 = vextractf64x4_avx512f(auVar110,1);
  auVar111 = vmulpd_avx512f(auVar112,auVar111);
  auVar105 = vextractf64x4_avx512f(auVar111,1);
  auVar112 = vmulpd_avx512f(auVar112,auVar113);
  auVar106 = vextractf64x4_avx512f(auVar112,1);
  auVar92._0_8_ =
       ((auVar107._0_8_ + auVar101._0_8_ + auVar107._8_8_ + auVar101._8_8_ +
        auVar107._16_8_ + auVar101._16_8_ + auVar107._24_8_ + auVar101._24_8_) -
       (auVar108._0_8_ + auVar102._0_8_ + auVar108._8_8_ + auVar102._8_8_ +
       auVar108._16_8_ + auVar102._16_8_ + auVar108._24_8_ + auVar102._24_8_)) * 0.5;
  dVar139 = ((auVar109._0_8_ + auVar103._0_8_ + auVar109._8_8_ + auVar103._8_8_ +
             auVar109._16_8_ + auVar103._16_8_ + auVar109._24_8_ + auVar103._24_8_) -
            (auVar110._0_8_ + auVar104._0_8_ + auVar110._8_8_ + auVar104._8_8_ +
            auVar110._16_8_ + auVar104._16_8_ + auVar110._24_8_ + auVar104._24_8_)) * 0.5;
  dVar44 = (auVar111._0_8_ + auVar105._0_8_ + auVar111._8_8_ + auVar105._8_8_ +
           auVar111._16_8_ + auVar105._16_8_ + auVar111._24_8_ + auVar105._24_8_) -
           (auVar112._0_8_ + auVar106._0_8_ + auVar112._8_8_ + auVar106._8_8_ +
           auVar112._16_8_ + auVar106._16_8_ + auVar112._24_8_ + auVar106._24_8_);
  pCVar41 = pSVar70->m_element;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = local_16c0[0];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (pCVar41->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>
                 .m_storage.m_data.array[0];
  auVar127._8_8_ = 0;
  auVar127._0_8_ =
       local_16c0[2] *
       (pCVar41->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[1];
  auVar88 = vfmadd231sd_fma(auVar127,auVar118,auVar9);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = local_16c0[4];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (pCVar41->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[2];
  auVar88 = vfmadd132sd_fma(auVar119,auVar88,auVar10);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = local_16c0[6];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (pCVar41->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[3];
  auVar88 = vfmadd132sd_fma(auVar142,auVar88,auVar11);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = local_1780._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (pCVar41->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[6];
  auVar152._8_8_ = 0;
  auVar152._0_8_ =
       local_1748 *
       (pCVar41->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[7];
  auVar84 = vfmadd231sd_fma(auVar152,auVar120,auVar12);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = local_17c0;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (pCVar41->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[4];
  auVar154._8_8_ = 0;
  auVar154._0_8_ =
       local_17b8 *
       (pCVar41->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[5];
  auVar83 = vfmadd231sd_fma(auVar154,auVar121,auVar13);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = auVar92._0_8_;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = local_18b0._0_8_;
  auVar82 = vmulsd_avx512f(auVar210,auVar131);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar139;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = local_1800._0_8_;
  auVar91 = vmulsd_avx512f(auVar188,auVar135);
  auVar91 = vmulsd_avx512f(auVar188,auVar91);
  auVar82 = vfmadd231sd_avx512f(auVar91,auVar210,auVar82);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = dVar44;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = local_18b0._0_8_;
  auVar91 = vmulsd_avx512f(auVar211,auVar149);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = local_1800._0_8_;
  auVar82 = vfmadd213sd_avx512f(auVar91,auVar189,auVar82);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar73;
  auVar91 = vmulsd_avx512f(auVar206,auVar88);
  auVar82 = vfmadd213sd_avx512f(auVar91,auVar206,auVar82);
  auVar91 = vmulsd_avx512f(auVar211,auVar84);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar73;
  auVar82 = vfmadd213sd_avx512f(auVar91,auVar207,auVar82);
  auVar91 = vmulsd_avx512f(auVar189,auVar83);
  auVar82 = vfmadd213sd_avx512f(auVar91,auVar207,auVar82);
  local_1850 = auVar82._0_8_;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = local_18c8;
  auVar82 = vmulsd_avx512f(auVar185,auVar131);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar74;
  auVar91 = vmulsd_avx512f(auVar194,auVar135);
  auVar91 = vmulsd_avx512f(auVar194,auVar91);
  auVar82 = vfmadd231sd_avx512f(auVar91,auVar185,auVar82);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = local_18c8;
  auVar91 = vmulsd_avx512f(auVar186,auVar149);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar74;
  auVar82 = vfmadd213sd_avx512f(auVar91,auVar195,auVar82);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = local_1820;
  auVar91 = vmulsd_avx512f(auVar191,auVar88);
  auVar82 = vfmadd213sd_avx512f(auVar91,auVar191,auVar82);
  auVar91 = vmulsd_avx512f(auVar186,auVar84);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = local_1820;
  auVar82 = vfmadd213sd_avx512f(auVar91,auVar192,auVar82);
  auVar91 = vmulsd_avx512f(auVar195,auVar83);
  auVar82 = vfmadd213sd_avx512f(auVar91,auVar192,auVar82);
  dStack_1848 = auVar82._0_8_;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = auVar92._0_8_ + auVar92._0_8_;
  auVar91 = vmulsd_avx512f(auVar211,auVar144);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar139 + dVar139;
  auVar85 = vmulsd_avx512f(auVar189,auVar161);
  auVar82 = vmulsd_avx512f(auVar195,auVar85);
  auVar82 = vfmadd231sd_avx512f(auVar82,auVar91,auVar186);
  auVar86 = vmulsd_avx512f(auVar211,auVar195);
  auVar87 = vfmadd231sd_avx512f(auVar86,auVar186,auVar189);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = dVar44;
  auVar82 = vfmadd231sd_fma(auVar82,auVar150,auVar87);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = auVar88._0_8_ + auVar88._0_8_;
  auVar86 = vmulsd_avx512f(auVar207,auVar180);
  auVar82 = vfmadd231sd_avx512f(auVar82,auVar86,auVar192);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = local_18b0._0_8_;
  auVar89 = vmulsd_avx512f(auVar192,auVar212);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = local_18c8;
  auVar89 = vfmadd231sd_avx512f(auVar89,auVar187,auVar207);
  auVar82 = vfmadd231sd_fma(auVar82,auVar84,auVar89);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = local_1800._0_8_;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = local_1820;
  auVar90 = vmulsd_avx512f(auVar193,auVar190);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar74;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar73;
  auVar90 = vfmadd231sd_avx512f(auVar90,auVar196,auVar208);
  auVar82 = vfmadd231sd_fma(auVar82,auVar83,auVar90);
  local_1840 = auVar82._0_8_;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = auVar92._0_8_;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = local_18c0._0_8_;
  auVar82 = vmulsd_avx512f(auVar198,auVar132);
  auVar177._8_8_ = 0;
  auVar177._0_8_ = local_1810._0_8_;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = (double)local_1810._0_8_ * (double)local_1810._0_8_ * dVar139;
  auVar82 = vfmadd231sd_avx512f(auVar136,auVar198,auVar82);
  auVar199._8_8_ = 0;
  auVar199._0_8_ = local_18c0._0_8_;
  auVar92 = vmulsd_avx512f(auVar199,auVar150);
  auVar82 = vfmadd213sd_fma(auVar92,auVar177,auVar82);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar72;
  auVar88 = vmulsd_avx512f(auVar202,auVar88);
  auVar88 = vfmadd213sd_avx512f(auVar88,auVar202,auVar82);
  auVar82 = vmulsd_avx512f(auVar199,auVar84);
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar72;
  auVar88 = vfmadd213sd_avx512f(auVar82,auVar203,auVar88);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = (double)local_1810._0_8_ * auVar83._0_8_;
  auVar88 = vfmadd213sd_avx512f(auVar137,auVar203,auVar88);
  dStack_1838 = auVar88._0_8_;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = (double)local_1810._0_8_ * auVar85._0_8_;
  auVar88 = vfmadd231sd_avx512f(auVar173,auVar199,auVar91);
  auVar82 = vmulsd_avx512f(auVar212,auVar177);
  auVar93 = vfmadd231sd_avx512f(auVar82,auVar199,auVar190);
  auVar88 = vfmadd231sd_fma(auVar88,auVar150,auVar93);
  auVar88 = vfmadd231sd_avx512f(auVar88,auVar203,auVar86);
  auVar82 = vmulsd_avx512f(auVar203,auVar212);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = local_18c0._0_8_;
  auVar94 = vfmadd231sd_avx512f(auVar82,auVar200,auVar208);
  auVar88 = vfmadd231sd_fma(auVar88,auVar84,auVar94);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar72;
  auVar82 = vmulsd_avx512f(auVar204,auVar190);
  auVar95 = vfmadd231sd_avx512f(auVar82,auVar177,auVar208);
  auVar88 = vfmadd231sd_fma(auVar88,auVar83,auVar95);
  local_1830 = auVar88._0_8_;
  auVar88 = vmulsd_avx512f(auVar187,auVar144);
  auVar82 = vmulsd_avx512f(auVar196,auVar161);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = (double)local_1810._0_8_ * auVar82._0_8_;
  auVar88 = vfmadd231sd_avx512f(auVar162,auVar200,auVar88);
  auVar82 = vmulsd_avx512f(auVar187,auVar177);
  auVar96 = vfmadd231sd_avx512f(auVar82,auVar200,auVar196);
  auVar88 = vfmadd231sd_fma(auVar88,auVar96,auVar150);
  auVar82 = vmulsd_avx512f(auVar193,auVar180);
  auVar88 = vfmadd213sd_avx512f(auVar82,auVar204,auVar88);
  auVar82 = vmulsd_avx512f(auVar204,auVar187);
  auVar97 = vfmadd231sd_avx512f(auVar82,auVar200,auVar193);
  auVar88 = vfmadd231sd_fma(auVar88,auVar97,auVar84);
  auVar82 = vmulsd_avx512f(auVar204,auVar196);
  auVar98 = vfmadd231sd_avx512f(auVar82,auVar177,auVar193);
  auVar88 = vfmadd231sd_fma(auVar88,auVar98,auVar83);
  dStack_1828 = auVar88._0_8_;
  auVar155._8_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar155._0_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  local_1780._0_16_ =
       *(undefined1 (*) [16])
        (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
        .array;
  auVar82 = vmulpd_avx512vl(local_1780._0_16_,auVar155);
  auVar163._8_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar163._0_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar88 = *(undefined1 (*) [16])
             ((pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 3);
  auVar84 = vfmadd231pd_avx512vl(auVar82,auVar163,auVar88);
  auVar167._8_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar167._0_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar174._8_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar174._0_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar178._8_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar178._0_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar181._8_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar181._0_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar183._8_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar183._0_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar99 = vmovddup_avx512vl(auVar14);
  auVar197._8_8_ = 0;
  auVar197._0_8_ =
       (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[2];
  auVar82 = vmulsd_avx512f(auVar155,auVar197);
  auVar201._8_8_ = 0;
  auVar201._0_8_ =
       (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[5];
  auVar83 = vmulsd_avx512f(auVar163,auVar201);
  auVar82 = vaddsd_avx512f(auVar82,auVar83);
  auVar205._8_8_ = 0;
  auVar205._0_8_ =
       (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[8];
  auVar83 = vmulsd_avx512f(auVar167,auVar205);
  auVar209._8_8_ = 0;
  auVar209._0_8_ =
       (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0xb];
  auVar91 = vmulsd_avx512f(auVar174,auVar209);
  auVar83 = vaddsd_avx512f(auVar83,auVar91);
  auVar83 = vaddsd_avx512f(auVar82,auVar83);
  auVar213._8_8_ = 0;
  auVar213._0_8_ =
       (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0xe];
  auVar82 = vmulsd_avx512f(auVar178,auVar213);
  auVar216._8_8_ = 0;
  auVar216._0_8_ =
       (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0x11];
  auVar91 = vmulsd_avx512f(auVar181,auVar216);
  auVar91 = vaddsd_avx512f(auVar82,auVar91);
  auVar221._8_8_ = 0;
  auVar221._0_8_ =
       (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0x14];
  auVar82 = vmulsd_avx512f(auVar183,auVar221);
  auVar226._8_8_ = 0;
  auVar226._0_8_ =
       (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0x17];
  auVar85 = vmulsd_avx512f(auVar99,auVar226);
  auVar85 = vaddsd_avx512f(auVar82,auVar85);
  auVar82 = *(undefined1 (*) [16])
             ((pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 6);
  auVar86 = vfmadd231pd_avx512vl(auVar84,auVar167,auVar82);
  auVar91 = vaddsd_avx512f(auVar91,auVar85);
  auVar84 = *(undefined1 (*) [16])
             ((pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 9);
  auVar85 = vfmadd231pd_avx512vl(auVar86,auVar174,auVar84);
  auVar92 = vaddsd_avx512f(auVar83,auVar91);
  auVar83 = *(undefined1 (*) [16])
             ((pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0xc);
  auVar85 = vfmadd231pd_avx512vl(auVar85,auVar178,auVar83);
  auVar91 = *(undefined1 (*) [16])
             ((pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0xf);
  auVar86 = vfmadd231pd_avx512vl(auVar85,auVar181,auVar91);
  auVar85 = *(undefined1 (*) [16])
             ((pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0x12);
  auVar100 = vfmadd231pd_avx512vl(auVar86,auVar183,auVar85);
  auVar86 = *(undefined1 (*) [16])
             ((pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0x15);
  local_17e0 = vfmadd231pd_avx512vl(auVar100,auVar99,auVar86);
  local_17d0 = (double)auVar92._0_8_;
  puVar75 = local_1640;
  lVar77 = 0;
  do {
    auVar92._0_8_ =
         local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
         array[lVar77];
    lVar80 = 0;
    do {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)(local_17e0 + lVar80 * 8);
      auVar231._8_8_ = 0;
      auVar231._0_8_ = auVar92._0_8_;
      auVar100 = vmulsd_avx512f(auVar231,auVar15);
      *(long *)(puVar75 + lVar80 * 8) = auVar100._0_8_;
      lVar80 = lVar80 + 1;
    } while (lVar80 != 3);
    lVar77 = lVar77 + 1;
    puVar75 = puVar75 + 0x18;
  } while (lVar77 != 8);
  puVar75 = local_1640;
  local_680.m_dst = (DstEvaluatorType *)local_1640._0_8_;
  local_680.m_src = (SrcEvaluatorType *)local_1640._8_8_;
  local_680.m_functor = paStack_1630;
  local_680.m_dstExpr = pDStack_1628;
  uStack_660 = uStack_1620;
  uStack_658 = uStack_1618;
  uStack_650 = uStack_1610;
  uStack_648 = uStack_1608;
  local_640 = local_1600._0_8_;
  uStack_638 = local_1600._8_8_;
  uStack_630 = local_1600._16_8_;
  uStack_628 = local_1600._24_8_;
  uStack_620 = local_1600._32_8_;
  uStack_618 = local_1600._40_8_;
  uStack_610 = local_1600._48_8_;
  uStack_608 = local_1600._56_8_;
  local_600 = local_15c0._0_8_;
  uStack_5f8 = local_15c0._8_8_;
  uStack_5f0 = local_15c0._16_8_;
  uStack_5e8 = local_15c0._24_8_;
  uStack_5e0 = local_15c0._32_8_;
  uStack_5d8 = local_15c0._40_8_;
  uStack_5d0 = local_15c0._48_8_;
  uStack_5c8 = local_15c0._56_8_;
  auVar164._8_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar164._0_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar168._0_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0] * (double)local_1780._0_8_;
  auVar168._8_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0] * (double)local_1780._8_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar92 = vmovddup_avx512vl(auVar16);
  auVar88 = vfmadd213pd_avx512vl(auVar88,auVar92,auVar168);
  auVar169._8_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar169._0_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar88 = vfmadd213pd_avx512vl(auVar82,auVar169,auVar88);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar82 = vmovddup_avx512vl(auVar17);
  auVar88 = vfmadd213pd_avx512vl(auVar84,auVar82,auVar88);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar84 = vmovddup_avx512vl(auVar18);
  auVar88 = vfmadd213pd_avx512vl(auVar83,auVar84,auVar88);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar83 = vmovddup_avx512vl(auVar19);
  auVar88 = vfmadd213pd_avx512vl(auVar91,auVar83,auVar88);
  auVar156._8_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar156._0_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar88 = vfmadd213pd_avx512vl(auVar85,auVar156,auVar88);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar91 = vmovddup_avx512vl(auVar20);
  local_17e0 = vfmadd213pd_avx512vl(auVar86,auVar91,auVar88);
  auVar88 = vmulsd_avx512f(auVar197,auVar164);
  auVar85 = vmulsd_avx512f(auVar201,auVar92);
  auVar88 = vaddsd_avx512f(auVar88,auVar85);
  auVar85 = vmulsd_avx512f(auVar205,auVar169);
  auVar82 = vmulsd_avx512f(auVar209,auVar82);
  auVar82 = vaddsd_avx512f(auVar85,auVar82);
  auVar84 = vmulsd_avx512f(auVar213,auVar84);
  auVar83 = vmulsd_avx512f(auVar216,auVar83);
  auVar84 = vaddsd_avx512f(auVar84,auVar83);
  auVar83 = vmulsd_avx512f(auVar221,auVar156);
  auVar91 = vmulsd_avx512f(auVar226,auVar91);
  auVar83 = vaddsd_avx512f(auVar83,auVar91);
  local_17d0 = auVar88._0_8_ + auVar82._0_8_ + auVar84._0_8_ + auVar83._0_8_;
  lVar77 = 0;
  do {
    auVar92._0_8_ =
         local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
         array[lVar77];
    lVar80 = 0;
    do {
      *(double *)(puVar75 + lVar80 * 8) = auVar92._0_8_ * *(double *)(local_17e0 + lVar80 * 8);
      lVar80 = lVar80 + 1;
    } while (lVar80 != 3);
    lVar77 = lVar77 + 1;
    puVar75 = puVar75 + 0x18;
  } while (lVar77 != 8);
  puVar75 = local_1640;
  local_5c0[0] = local_1640._0_8_;
  local_5c0[1] = local_1640._8_8_;
  local_5c0[2] = (ulong)paStack_1630;
  local_5c0[3] = (ulong)pDStack_1628;
  local_5c0[4] = uStack_1620;
  local_5c0[5] = uStack_1618;
  local_5c0[6] = uStack_1610;
  local_5c0[7] = uStack_1608;
  local_5c0[8] = local_1600._0_8_;
  local_5c0[9] = local_1600._8_8_;
  local_5c0[10] = local_1600._16_8_;
  local_5c0[0xb] = local_1600._24_8_;
  local_5c0[0xc] = local_1600._32_8_;
  local_5c0[0xd] = local_1600._40_8_;
  local_5c0[0xe] = local_1600._48_8_;
  local_5c0[0xf] = local_1600._56_8_;
  local_5c0[0x10] = local_15c0._0_8_;
  local_5c0[0x11] = local_15c0._8_8_;
  local_5c0[0x12] = local_15c0._16_8_;
  local_5c0[0x13] = local_15c0._24_8_;
  local_5c0[0x14] = local_15c0._32_8_;
  local_5c0[0x15] = local_15c0._40_8_;
  local_5c0[0x16] = local_15c0._48_8_;
  local_5c0[0x17] = local_15c0._56_8_;
  auVar157._0_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0] *
       (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0];
  auVar157._8_8_ =
       local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0] *
       (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[1];
  auVar88 = vfmadd231pd_fma(auVar157,auVar163,
                            *(undefined1 (*) [16])
                             ((pCVar41->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 3));
  auVar88 = vfmadd231pd_avx512vl
                      (auVar88,auVar167,
                       *(undefined1 (*) [16])
                        ((pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>
                         .m_storage.m_data.array + 6));
  auVar88 = vfmadd231pd_fma(auVar88,auVar174,
                            *(undefined1 (*) [16])
                             ((pCVar41->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 9));
  auVar88 = vfmadd231pd_fma(auVar88,auVar178,
                            *(undefined1 (*) [16])
                             ((pCVar41->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xc));
  auVar88 = vfmadd231pd_fma(auVar88,auVar181,
                            *(undefined1 (*) [16])
                             ((pCVar41->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xf));
  auVar88 = vfmadd231pd_fma(auVar88,auVar183,
                            *(undefined1 (*) [16])
                             ((pCVar41->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x12));
  local_1510 = vfmadd231pd_avx512vl
                         (auVar88,auVar99,
                          *(undefined1 (*) [16])
                           ((pCVar41->m_d).
                            super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                            m_data.array + 0x15));
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[8];
  auVar88 = vmulsd_avx512f(auVar167,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0x17];
  auVar82 = vmulsd_avx512f(auVar99,auVar22);
  local_1500 = local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[0] *
               (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[2] +
               local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[1] *
               (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[5] +
               auVar88._0_8_ +
               local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[3] *
               (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[0xb] +
               local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[4] *
               (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[0xe] +
               local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[5] *
               (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[0x11] +
               local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[6] *
               (pCVar41->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[0x14] + auVar82._0_8_;
  lVar77 = 0;
  do {
    auVar158._8_8_ = 0;
    auVar158._0_8_ =
         local_1700.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
         array[lVar77];
    auVar92._0_8_ =
         local_1740.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
         array[lVar77];
    lVar80 = 0;
    do {
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)(local_17e0 + lVar80 * 8);
      auVar170._8_8_ = 0;
      auVar170._0_8_ = auVar92._0_8_ * *(double *)(local_1510 + lVar80 * 8);
      auVar88 = vfmadd231sd_fma(auVar170,auVar158,auVar23);
      *(long *)(puVar75 + lVar80 * 8) = auVar88._0_8_;
      lVar80 = lVar80 + 1;
    } while (lVar80 != 3);
    lVar77 = lVar77 + 1;
    puVar75 = puVar75 + 0x18;
  } while (lVar77 != 8);
  local_500[0] = local_1640._0_8_;
  local_500[1] = local_1640._8_8_;
  local_500[2] = (ulong)paStack_1630;
  local_500[3] = (ulong)pDStack_1628;
  local_500[4] = uStack_1620;
  local_500[5] = uStack_1618;
  local_500[6] = uStack_1610;
  local_500[7] = uStack_1608;
  local_500[8] = local_1600._0_8_;
  local_500[9] = local_1600._8_8_;
  local_500[10] = local_1600._16_8_;
  local_500[0xb] = local_1600._24_8_;
  local_500[0xc] = local_1600._32_8_;
  local_500[0xd] = local_1600._40_8_;
  local_500[0xe] = local_1600._48_8_;
  local_500[0xf] = local_1600._56_8_;
  local_500[0x10] = local_15c0._0_8_;
  local_500[0x11] = local_15c0._8_8_;
  local_500[0x12] = local_15c0._16_8_;
  local_500[0x13] = local_15c0._24_8_;
  local_500[0x14] = local_15c0._32_8_;
  local_500[0x15] = local_15c0._40_8_;
  local_500[0x16] = local_15c0._48_8_;
  local_500[0x17] = local_15c0._56_8_;
  _local_1640 = ZEXT864(0) << 0x40;
  pdVar71 = (pCVar41->m_strainANS_D).super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>.
            m_storage.m_data.array + 0x10;
  lVar77 = 0;
  local_15c0 = _local_1640;
  local_1600 = _local_1640;
  do {
    if (((ulong)pCVar41 & 0x3f) != 0) {
      __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                    "Eigen::internal::block_evaluator<Eigen::Matrix<double, 8, 24, 1>, 1, 24, true>::block_evaluator(const XprType &) [ArgType = Eigen::Matrix<double, 8, 24, 1>, BlockRows = 1, BlockCols = 24, InnerPanel = true, HasDirectAccess = true]"
                   );
    }
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)((long)local_16c0 + lVar77);
    auVar110 = vbroadcastsd_avx512f(auVar24);
    auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])
                                        ((plain_array<double,_192,_1,_64> *)(pdVar71 + -0x10))->
                                        array);
    _local_1640 = vaddpd_avx512f(_local_1640,auVar112);
    auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar71 + -8));
    local_1600 = vaddpd_avx512f(local_1600,auVar112);
    auVar110 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])pdVar71);
    local_15c0 = vaddpd_avx512f(local_15c0,auVar110);
    lVar77 = lVar77 + 0x10;
    pdVar71 = pdVar71 + 0x18;
  } while (lVar77 != 0x40);
  local_440 = _local_1640;
  local_400 = local_1600;
  local_3c0 = local_15c0;
  local_380 = ZEXT864(0) << 0x40;
  pdVar71 = (pCVar41->m_strainANS_D).super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>.
            m_storage.m_data.array + 0xa0;
  lVar77 = 2;
  local_340 = local_380;
  local_300 = local_380;
  do {
    auVar25._8_8_ = 0;
    auVar25._0_8_ = (&local_17c0)[lVar77];
    auVar110 = vbroadcastsd_avx512f(auVar25);
    auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar71 + -0x10));
    local_380 = vaddpd_avx512f(local_380,auVar112);
    auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar71 + -8));
    local_340 = vaddpd_avx512f(local_340,auVar112);
    auVar110 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])pdVar71);
    local_300 = vaddpd_avx512f(local_300,auVar110);
    lVar77 = lVar77 + 1;
    pdVar71 = pdVar71 + 0x18;
  } while (lVar77 == 3);
  _local_1640 = ZEXT864(0) << 0x40;
  pdVar71 = (pCVar41->m_strainANS_D).super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>.
            m_storage.m_data.array + 0x70;
  lVar77 = 0;
  local_1600 = _local_1640;
  local_15c0 = _local_1640;
  do {
    auVar26._8_8_ = 0;
    auVar26._0_8_ = (&local_17c0)[lVar77];
    auVar110 = vbroadcastsd_avx512f(auVar26);
    auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar71 + -0x10));
    _local_1640 = vaddpd_avx512f(_local_1640,auVar112);
    auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar71 + -8));
    local_1600 = vaddpd_avx512f(local_1600,auVar112);
    auVar110 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])pdVar71);
    local_15c0 = vaddpd_avx512f(local_15c0,auVar110);
    lVar77 = lVar77 + 1;
    pdVar71 = pdVar71 + 0x18;
  } while (lVar77 == 1);
  local_2c0 = _local_1640;
  local_280 = local_1600;
  local_240 = local_15c0;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uStack_658;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = local_1810._0_8_;
  auVar88 = vmulsd_avx512f(auVar229,auVar27);
  lVar77 = 0;
  do {
    auVar179._8_8_ = 0;
    auVar179._0_8_ = (&local_680.m_dst)[lVar77];
    auVar182._8_8_ = 0;
    auVar182._0_8_ = local_5c0[lVar77];
    auVar214._8_8_ = 0;
    auVar214._0_8_ = local_18b0._0_8_;
    auVar82 = vmulsd_avx512f(auVar214,auVar179);
    auVar227._8_8_ = 0;
    auVar227._0_8_ = local_1800._0_8_;
    auVar84 = vmulsd_avx512f(auVar227,auVar182);
    auVar84 = vmulsd_avx512f(auVar227,auVar84);
    auVar82 = vfmadd231sd_avx512f(auVar84,auVar214,auVar82);
    auVar165._8_8_ = 0;
    auVar165._0_8_ = local_500[lVar77];
    auVar215._8_8_ = 0;
    auVar215._0_8_ = local_18b0._0_8_;
    auVar84 = vmulsd_avx512f(auVar215,auVar165);
    auVar228._8_8_ = 0;
    auVar228._0_8_ = local_1800._0_8_;
    auVar82 = vfmadd213sd_avx512f(auVar84,auVar228,auVar82);
    auVar184._8_8_ = 0;
    auVar184._0_8_ = *(ulong *)(local_440 + lVar77 * 8);
    auVar232._8_8_ = 0;
    auVar232._0_8_ = uVar73;
    auVar84 = vmulsd_avx512f(auVar232,auVar184);
    auVar82 = vfmadd213sd_avx512f(auVar84,auVar232,auVar82);
    auVar171._8_8_ = 0;
    auVar171._0_8_ = *(ulong *)(local_380 + lVar77 * 8);
    auVar84 = vmulsd_avx512f(auVar215,auVar171);
    auVar233._8_8_ = 0;
    auVar233._0_8_ = uVar73;
    auVar82 = vfmadd213sd_avx512f(auVar84,auVar233,auVar82);
    auVar175._8_8_ = 0;
    auVar175._0_8_ = *(ulong *)(local_2c0 + lVar77 * 8);
    auVar84 = vmulsd_avx512f(auVar228,auVar175);
    auVar82 = vfmadd213sd_avx512f(auVar84,auVar233,auVar82);
    vmovsd_avx512f(auVar82);
    *(undefined8 *)(auStack_af8 + lVar77 * 8 + -8) = *(undefined8 *)(auStack_af8 + lVar77 * 8 + -8);
    auVar217._8_8_ = 0;
    auVar217._0_8_ = local_18c8;
    auVar82 = vmulsd_avx512f(auVar217,auVar179);
    auVar238._8_8_ = 0;
    auVar238._0_8_ = uVar74;
    auVar84 = vmulsd_avx512f(auVar238,auVar182);
    auVar84 = vmulsd_avx512f(auVar238,auVar84);
    auVar82 = vfmadd231sd_avx512f(auVar84,auVar217,auVar82);
    auVar218._8_8_ = 0;
    auVar218._0_8_ = local_18c8;
    auVar84 = vmulsd_avx512f(auVar218,auVar165);
    auVar239._8_8_ = 0;
    auVar239._0_8_ = uVar74;
    auVar82 = vfmadd213sd_avx512f(auVar84,auVar239,auVar82);
    auVar234._8_8_ = 0;
    auVar234._0_8_ = local_1820;
    auVar84 = vmulsd_avx512f(auVar234,auVar184);
    auVar82 = vfmadd213sd_avx512f(auVar84,auVar234,auVar82);
    auVar84 = vmulsd_avx512f(auVar218,auVar171);
    auVar235._8_8_ = 0;
    auVar235._0_8_ = local_1820;
    auVar82 = vfmadd213sd_avx512f(auVar84,auVar235,auVar82);
    auVar84 = vmulsd_avx512f(auVar239,auVar175);
    auVar82 = vfmadd213sd_avx512f(auVar84,auVar235,auVar82);
    vmovsd_avx512f(auVar82);
    *(undefined8 *)(local_a40 + lVar77 * 8) = *(undefined8 *)(local_a40 + lVar77 * 8);
    auVar84 = vaddsd_avx512f(auVar179,auVar179);
    auVar82 = vmulsd_avx512f(auVar215,auVar84);
    auVar83 = vaddsd_avx512f(auVar182,auVar182);
    auVar91 = vmulsd_avx512f(auVar228,auVar83);
    auVar85 = vmulsd_avx512f(auVar239,auVar91);
    auVar85 = vfmadd231sd_avx512f(auVar85,auVar82,auVar218);
    auVar85 = vfmadd231sd_avx512f(auVar85,auVar165,auVar87);
    auVar86 = vaddsd_avx512f(auVar184,auVar184);
    auVar92 = vmulsd_avx512f(auVar233,auVar86);
    auVar85 = vfmadd231sd_avx512f(auVar85,auVar92,auVar235);
    auVar85 = vfmadd231sd_avx512f(auVar85,auVar171,auVar89);
    auVar85 = vfmadd231sd_avx512f(auVar85,auVar175,auVar90);
    vmovsd_avx512f(auVar85);
    *(undefined8 *)(local_980 + lVar77 * 8) = *(undefined8 *)(local_980 + lVar77 * 8);
    auVar222._8_8_ = 0;
    auVar222._0_8_ = local_18c0._0_8_;
    auVar85 = vmulsd_avx512f(auVar222,auVar179);
    auVar99 = vmulsd_avx512f(auVar229,auVar182);
    auVar230._8_8_ = 0;
    auVar230._0_8_ = local_1810._0_8_;
    auVar99 = vmulsd_avx512f(auVar230,auVar99);
    auVar85 = vfmadd231sd_avx512f(auVar99,auVar222,auVar85);
    auVar223._8_8_ = 0;
    auVar223._0_8_ = local_18c0._0_8_;
    auVar99 = vmulsd_avx512f(auVar223,auVar165);
    auVar85 = vfmadd213sd_avx512f(auVar99,auVar230,auVar85);
    auVar236._8_8_ = 0;
    auVar236._0_8_ = uVar72;
    auVar99 = vmulsd_avx512f(auVar236,auVar184);
    auVar85 = vfmadd213sd_avx512f(auVar99,auVar236,auVar85);
    auVar99 = vmulsd_avx512f(auVar223,auVar171);
    auVar237._8_8_ = 0;
    auVar237._0_8_ = uVar72;
    auVar85 = vfmadd213sd_avx512f(auVar99,auVar237,auVar85);
    auVar85 = vfmadd231sd_avx512f(auVar85,auVar88,auVar237);
    *(long *)(local_8c0 + lVar77 * 8) = auVar85._0_8_;
    auVar91 = vmulsd_avx512f(auVar230,auVar91);
    auVar82 = vfmadd231sd_avx512f(auVar91,auVar223,auVar82);
    auVar82 = vfmadd231sd_fma(auVar82,auVar165,auVar93);
    auVar82 = vfmadd231sd_avx512f(auVar82,auVar237,auVar92);
    auVar82 = vfmadd231sd_fma(auVar82,auVar171,auVar94);
    auVar82 = vfmadd231sd_fma(auVar82,auVar175,auVar95);
    *(long *)(local_800 + lVar77 * 8) = auVar82._0_8_;
    auVar82 = vmulsd_avx512f(auVar218,auVar84);
    auVar84 = vmulsd_avx512f(auVar239,auVar83);
    auVar84 = vmulsd_avx512f(auVar230,auVar84);
    auVar82 = vfmadd231sd_avx512f(auVar84,auVar223,auVar82);
    auVar82 = vfmadd231sd_fma(auVar82,auVar96,auVar165);
    auVar84 = vmulsd_avx512f(auVar235,auVar86);
    auVar82 = vfmadd213sd_avx512f(auVar84,auVar237,auVar82);
    auVar82 = vfmadd231sd_fma(auVar82,auVar97,auVar171);
    auVar82 = vfmadd231sd_fma(auVar82,auVar98,auVar175);
    *(long *)(local_740 + lVar77 * 8) = auVar82._0_8_;
    lVar77 = lVar77 + 1;
  } while (lVar77 != 0x18);
  auVar88 = ZEXT816(0) << 0x40;
  lVar77 = 0;
  auVar82 = ZEXT816(0) << 0x40;
  auVar84 = ZEXT816(0) << 0x40;
  do {
    auVar145._8_8_ = 0;
    auVar145._0_8_ =
         (pCVar41->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
         m_data.array[lVar77];
    auVar83 = vshufpd_avx(auVar88,auVar88,1);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)(auStack_af8 + lVar77 * 8 + -8);
    auVar88 = vfmadd231sd_fma(auVar88,auVar145,auVar28);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *(ulong *)(local_a40 + lVar77 * 8);
    auVar83 = vfmadd231sd_fma(auVar83,auVar145,auVar29);
    auVar88 = vunpcklpd_avx(auVar88,auVar83);
    auVar83 = vshufpd_avx(auVar82,auVar82,1);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *(ulong *)(local_980 + lVar77 * 8);
    auVar82 = vfmadd231sd_fma(auVar82,auVar145,auVar30);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *(ulong *)(local_8c0 + lVar77 * 8);
    auVar83 = vfmadd231sd_fma(auVar83,auVar145,auVar31);
    auVar82 = vunpcklpd_avx(auVar82,auVar83);
    auVar83 = vshufpd_avx(auVar84,auVar84,1);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = *(ulong *)(local_800 + lVar77 * 8);
    auVar84 = vfmadd231sd_fma(auVar84,auVar145,auVar32);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *(ulong *)(local_740 + lVar77 * 8);
    auVar83 = vfmadd231sd_fma(auVar83,auVar145,auVar33);
    auVar84 = vunpcklpd_avx(auVar84,auVar83);
    lVar77 = lVar77 + 1;
  } while (lVar77 != 0x18);
  auVar92._0_8_ = pCVar41->m_Alpha;
  local_1850 = local_14f0[0] + local_1850 + auVar88._0_8_ * auVar92._0_8_;
  dStack_1848 = local_14f0[1] + dStack_1848 + auVar88._8_8_ * auVar92._0_8_;
  local_1840 = local_14f0[2] + local_1840 + auVar82._0_8_ * auVar92._0_8_;
  dStack_1838 = local_14f0[3] + dStack_1838 + auVar82._8_8_ * auVar92._0_8_;
  local_1830 = local_14f0[4] + local_1830 + auVar84._0_8_ * auVar92._0_8_;
  dStack_1828 = local_14f0[5] + dStack_1828 + auVar84._8_8_ * auVar92._0_8_;
  pLVar42 = (pCVar41->m_layers).
            super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar43 = pLVar42[pSVar70->m_kl].m_material.
            super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = pLVar42[pSVar70->m_kl].m_material.
            super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pCVar76 = &peVar43->m_E_eps;
  pCVar41 = pSVar70->m_element;
  auVar92._0_8_ = pCVar41->m_GaussScaling;
  local_1140._64_8_ = local_1140 + 0x80;
  auVar109._8_56_ = auStack_af8;
  auVar109._0_8_ = local_b00.data;
  lVar77 = 0x10;
  do {
    uVar5 = *(undefined8 *)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>;
    auVar46._8_8_ = uVar5;
    auVar46._0_8_ = uVar5;
    auVar46._16_8_ = uVar5;
    auVar46._24_8_ = uVar5;
    auVar46._32_8_ = uVar5;
    auVar46._40_8_ = uVar5;
    auVar46._48_8_ = uVar5;
    auVar46._56_8_ = uVar5;
    auVar110 = vmulpd_avx512f(auVar109,auVar46);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0x30)
    ;
    auVar47._8_8_ = dVar139;
    auVar47._0_8_ = dVar139;
    auVar47._16_8_ = dVar139;
    auVar47._24_8_ = dVar139;
    auVar47._32_8_ = dVar139;
    auVar47._40_8_ = dVar139;
    auVar47._48_8_ = dVar139;
    auVar47._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_a40,auVar47);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0x60)
    ;
    auVar48._8_8_ = dVar139;
    auVar48._0_8_ = dVar139;
    auVar48._16_8_ = dVar139;
    auVar48._24_8_ = dVar139;
    auVar48._32_8_ = dVar139;
    auVar48._40_8_ = dVar139;
    auVar48._48_8_ = dVar139;
    auVar48._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_980,auVar48);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0x90)
    ;
    auVar49._8_8_ = dVar139;
    auVar49._0_8_ = dVar139;
    auVar49._16_8_ = dVar139;
    auVar49._24_8_ = dVar139;
    auVar49._32_8_ = dVar139;
    auVar49._40_8_ = dVar139;
    auVar49._48_8_ = dVar139;
    auVar49._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_8c0,auVar49);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0xc0)
    ;
    auVar50._8_8_ = dVar139;
    auVar50._0_8_ = dVar139;
    auVar50._16_8_ = dVar139;
    auVar50._24_8_ = dVar139;
    auVar50._32_8_ = dVar139;
    auVar50._40_8_ = dVar139;
    auVar50._48_8_ = dVar139;
    auVar50._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_800,auVar50);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0xf0)
    ;
    auVar51._8_8_ = dVar139;
    auVar51._0_8_ = dVar139;
    auVar51._16_8_ = dVar139;
    auVar51._24_8_ = dVar139;
    auVar51._32_8_ = dVar139;
    auVar51._40_8_ = dVar139;
    auVar51._48_8_ = dVar139;
    auVar51._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_740,auVar51);
    *(undefined1 (*) [64])(local_1040 + lVar77 * 8) = auVar110;
    uVar5 = *(undefined8 *)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>;
    auVar52._8_8_ = uVar5;
    auVar52._0_8_ = uVar5;
    auVar52._16_8_ = uVar5;
    auVar52._24_8_ = uVar5;
    auVar52._32_8_ = uVar5;
    auVar52._40_8_ = uVar5;
    auVar52._48_8_ = uVar5;
    auVar52._56_8_ = uVar5;
    auVar110 = vmulpd_avx512f(local_ac0,auVar52);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0x30)
    ;
    auVar53._8_8_ = dVar139;
    auVar53._0_8_ = dVar139;
    auVar53._16_8_ = dVar139;
    auVar53._24_8_ = dVar139;
    auVar53._32_8_ = dVar139;
    auVar53._40_8_ = dVar139;
    auVar53._48_8_ = dVar139;
    auVar53._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_a00,auVar53);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0x60)
    ;
    auVar54._8_8_ = dVar139;
    auVar54._0_8_ = dVar139;
    auVar54._16_8_ = dVar139;
    auVar54._24_8_ = dVar139;
    auVar54._32_8_ = dVar139;
    auVar54._40_8_ = dVar139;
    auVar54._48_8_ = dVar139;
    auVar54._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_940,auVar54);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0x90)
    ;
    auVar55._8_8_ = dVar139;
    auVar55._0_8_ = dVar139;
    auVar55._16_8_ = dVar139;
    auVar55._24_8_ = dVar139;
    auVar55._32_8_ = dVar139;
    auVar55._40_8_ = dVar139;
    auVar55._48_8_ = dVar139;
    auVar55._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_880,auVar55);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0xc0)
    ;
    auVar56._8_8_ = dVar139;
    auVar56._0_8_ = dVar139;
    auVar56._16_8_ = dVar139;
    auVar56._24_8_ = dVar139;
    auVar56._32_8_ = dVar139;
    auVar56._40_8_ = dVar139;
    auVar56._48_8_ = dVar139;
    auVar56._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_7c0,auVar56);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0xf0)
    ;
    auVar57._8_8_ = dVar139;
    auVar57._0_8_ = dVar139;
    auVar57._16_8_ = dVar139;
    auVar57._24_8_ = dVar139;
    auVar57._32_8_ = dVar139;
    auVar57._40_8_ = dVar139;
    auVar57._48_8_ = dVar139;
    auVar57._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_700,auVar57);
    *(undefined1 (*) [64])(auStack_1000 + lVar77 * 8) = auVar110;
    uVar5 = *(undefined8 *)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>;
    auVar58._8_8_ = uVar5;
    auVar58._0_8_ = uVar5;
    auVar58._16_8_ = uVar5;
    auVar58._24_8_ = uVar5;
    auVar58._32_8_ = uVar5;
    auVar58._40_8_ = uVar5;
    auVar58._48_8_ = uVar5;
    auVar58._56_8_ = uVar5;
    auVar110 = vmulpd_avx512f(local_a80,auVar58);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0x30)
    ;
    auVar59._8_8_ = dVar139;
    auVar59._0_8_ = dVar139;
    auVar59._16_8_ = dVar139;
    auVar59._24_8_ = dVar139;
    auVar59._32_8_ = dVar139;
    auVar59._40_8_ = dVar139;
    auVar59._48_8_ = dVar139;
    auVar59._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_9c0,auVar59);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0x60)
    ;
    auVar60._8_8_ = dVar139;
    auVar60._0_8_ = dVar139;
    auVar60._16_8_ = dVar139;
    auVar60._24_8_ = dVar139;
    auVar60._32_8_ = dVar139;
    auVar60._40_8_ = dVar139;
    auVar60._48_8_ = dVar139;
    auVar60._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_900,auVar60);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0x90)
    ;
    auVar61._8_8_ = dVar139;
    auVar61._0_8_ = dVar139;
    auVar61._16_8_ = dVar139;
    auVar61._24_8_ = dVar139;
    auVar61._32_8_ = dVar139;
    auVar61._40_8_ = dVar139;
    auVar61._48_8_ = dVar139;
    auVar61._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_840,auVar61);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0xc0)
    ;
    auVar62._8_8_ = dVar139;
    auVar62._0_8_ = dVar139;
    auVar62._16_8_ = dVar139;
    auVar62._24_8_ = dVar139;
    auVar62._32_8_ = dVar139;
    auVar62._40_8_ = dVar139;
    auVar62._48_8_ = dVar139;
    auVar62._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_780,auVar62);
    dVar139 = *(double *)
               ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0xf0)
    ;
    auVar63._8_8_ = dVar139;
    auVar63._0_8_ = dVar139;
    auVar63._16_8_ = dVar139;
    auVar63._24_8_ = dVar139;
    auVar63._32_8_ = dVar139;
    auVar63._40_8_ = dVar139;
    auVar63._48_8_ = dVar139;
    auVar63._56_8_ = dVar139;
    auVar110 = vfmadd231pd_avx512f(auVar110,local_6c0,auVar63);
    *(undefined1 (*) [64])(local_fc0 + lVar77 * 8) = auVar110;
    lVar77 = lVar77 + 0x18;
    pCVar76 = (ChMatrixNM<double,_6,_6> *)
              ((long)&pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 8);
  } while (lVar77 != 0xa0);
  local_b40 = &local_1850;
  local_b38 = rhs;
  local_b30 = &local_1850;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_1850;
  auVar110 = vbroadcastsd_avx512f(auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dStack_1848;
  auVar112 = vbroadcastsd_avx512f(auVar35);
  local_b28 = 6;
  auVar66._8_8_ = local_fc0._8_8_;
  auVar66._0_8_ = local_fc0._0_8_;
  auVar66._16_8_ = local_fc0._16_8_;
  auVar66._24_8_ = local_fc0._24_8_;
  auVar66._32_8_ = local_fc0._32_8_;
  auVar66._40_24_ = local_fc0._40_24_;
  auVar111 = vmulpd_avx512f(auVar110,auVar66);
  auVar111 = vfmadd231pd_avx512f(auVar111,auVar112,local_f00);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_1840;
  auVar107 = vbroadcastsd_avx512f(auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dStack_1838;
  auVar113 = vbroadcastsd_avx512f(auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_1830;
  auVar108 = vbroadcastsd_avx512f(auVar38);
  auVar111 = vfmadd231pd_avx512f(auVar111,auVar107,local_e40);
  auVar111 = vfmadd231pd_avx512f(auVar111,auVar113,local_d80);
  auVar111 = vfmadd231pd_avx512f(auVar111,auVar108,local_cc0);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dStack_1828;
  auVar109 = vbroadcastsd_avx512f(auVar39);
  local_1140._128_64_ = vfmadd231pd_avx512f(auVar111,auVar109,local_c00);
  auVar67._16_8_ = dStack_f70;
  auVar67._0_16_ = local_f80;
  auVar67._24_40_ = auStack_f68;
  auVar111 = vmulpd_avx512f(auVar110,auVar67);
  auVar69._16_8_ = dStack_eb0;
  auVar69._0_16_ = local_ec0;
  auVar69._24_40_ = auStack_ea8;
  auVar111 = vfmadd231pd_avx512f(auVar111,auVar112,auVar69);
  auVar111 = vfmadd231pd_avx512f(auVar111,auVar107,local_e00);
  auVar111 = vfmadd231pd_avx512f(auVar111,auVar113,local_d40);
  auVar111 = vfmadd231pd_avx512f(auVar111,auVar108,local_c80);
  local_1080 = vfmadd231pd_avx512f(auVar111,auVar109,local_bc0);
  auVar68._8_40_ = auStack_f38;
  auVar68._0_8_ = local_f40;
  auVar68._48_8_ = dStack_f10;
  auVar68._56_8_ = uStack_f08;
  auVar110 = vmulpd_avx512f(auVar110,auVar68);
  auVar110 = vfmadd231pd_avx512f(auVar110,auVar112,local_e80);
  auVar110 = vfmadd231pd_avx512f(auVar110,auVar107,local_dc0);
  auVar110 = vfmadd231pd_avx512f(auVar110,auVar113,local_d00);
  auVar110 = vfmadd231pd_avx512f(auVar110,auVar108,local_c40);
  local_1040 = vfmadd231pd_avx512f(auVar110,auVar109,local_b80);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = local_1670 * auVar92._0_8_;
  auVar110 = vbroadcastsd_avx512f(auVar122);
  local_1280 = vmulpd_avx512f(auVar110,local_1140._128_64_);
  local_1240 = vmulpd_avx512f(auVar110,local_1080);
  local_1200 = vmulpd_avx512f(auVar110,local_1040);
  lVar77 = 0;
  do {
    auVar92._0_8_ =
         local_1370.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.
         array[lVar77];
    dVar139 = local_1370.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.
              m_data.array[lVar77 + 5];
    dVar44 = local_1370.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.
             m_data.array[lVar77 + 10];
    dVar114 = local_1370.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.
              m_data.array[lVar77 + 0xf];
    dVar45 = *(double *)(local_1280 + lVar77 * 8 + -0x50);
    dVar115 = *(double *)(local_1280 + lVar77 * 8 + -0x28);
    lVar80 = 0;
    do {
      rhs[lVar80].m_matrix =
           (non_const_type)
           (auVar92._0_8_ * *(double *)((long)&peVar43->m_E_eps + lVar80 * 8) +
            dVar44 * *(double *)((long)&peVar43->m_E_eps + lVar80 * 8 + 0x60U) +
            dVar139 * *(double *)((long)&peVar43->m_E_eps + lVar80 * 8 + 0x30U) +
           dVar45 * *(double *)((long)&peVar43->m_E_eps + lVar80 * 8 + 0xc0U) +
           dVar115 * *(double *)((long)&peVar43->m_E_eps + lVar80 * 8 + 0xf0U) +
           dVar114 * *(double *)((long)&peVar43->m_E_eps + lVar80 * 8 + 0x90U));
      lVar80 = lVar80 + 1;
    } while (lVar80 != 6);
    lVar77 = lVar77 + 1;
    rhs = rhs + 6;
  } while (lVar77 != 5);
  local_1520 = pCVar41->m_GaussScaling;
  local_1140._8_8_ = local_1140 + 0x10;
  lVar77 = 2;
  pdVar71 = (double *)(local_fc0 + 0x20);
  do {
    auVar92._0_8_ = local_1850 * pdVar71[-4] + local_1840 * pdVar71[-2] + local_1830 * *pdVar71;
    dVar139 = dStack_1848 * pdVar71[-3] + dStack_1838 * pdVar71[-1] + dStack_1828 * pdVar71[1];
    auVar138._0_8_ = auVar92._0_8_ + dVar139;
    auVar138._8_8_ = auVar92._0_8_ + dVar139;
    uVar5 = vmovlpd_avx(auVar138);
    *(undefined8 *)(local_1140 + lVar77 * 8) = uVar5;
    lVar77 = lVar77 + 1;
    pdVar71 = pdVar71 + 6;
  } while (lVar77 != 7);
  local_1520 = local_1670 * local_1520;
  local_1540 = local_1520 * (double)local_1140._16_8_;
  dStack_1538 = local_1520 * (double)local_1140._24_8_;
  local_1530 = local_1520 * (double)local_1140._32_8_;
  dStack_1528 = local_1520 * (double)local_1140._40_8_;
  local_1520 = local_1520 * (double)local_1140._48_8_;
  local_1e8.m_rhs.m_functor.m_other = local_1670 * pCVar41->m_GaussScaling;
  local_1e8.m_lhs.m_lhs = (LhsNested)local_fc0;
  local_1e8.m_lhs.m_rhs = &local_1370;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,5,5,1,5,5>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,5,6,1,5,6>,Eigen::Matrix<double,6,5,1,6,5>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,5,5,0,5,5>const>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_5,_5,_1,_5,_5> *)local_1140,&local_1e8,&local_18c9);
  iVar65 = (int)((ulong)__dest >> 3);
  uVar78 = -iVar65 & 6;
  uVar74 = (ulong)uVar78;
  uVar81 = 0x18 - uVar78 & 0xfffffff8;
  if (uVar74 != 0) {
    memcpy(__dest,local_1280,(ulong)(iVar65 * -8 & 0x30));
  }
  uVar72 = (ulong)(iVar65 * -8 & 0x30);
  uVar73 = (ulong)(uVar81 | uVar78);
  if (uVar73 <= uVar74 + 8) {
    uVar73 = uVar74 + 8;
  }
  memcpy((void *)((long)(__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                        m_storage.m_data.array + uVar72),local_1280 + uVar72,
         (~uVar74 + uVar73 & 0xffffffffffffff8) * 8 + 0x40);
  if (uVar74 != 0) {
    uVar74 = (ulong)((iVar65 * -8 & 0x30U) + (0x18 - uVar78 & 0xfffffff8) * 8);
    memcpy((void *)((long)(__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                          m_storage.m_data.array + uVar74),local_1280 + uVar74,
           0xc0 - (ulong)((uVar78 | uVar81) << 3));
  }
  pdVar71 = (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
            m_data.array + 0x18;
  uVar81 = -((uint)((ulong)pdVar71 >> 3) & 0x1fffffff) & 6;
  uVar78 = 5;
  if (uVar81 < 5) {
    uVar78 = uVar81;
  }
  if (uVar81 != 0) {
    memcpy(pdVar71,&local_1540,(ulong)(uVar78 * 8));
  }
  if (uVar81 < 5) {
    uVar74 = (ulong)(uVar78 << 3);
    memcpy((void *)((long)(__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                          m_storage.m_data.array + uVar74 + 0xc0),
           (void *)((long)&local_1540 + uVar74),0x28 - uVar74);
  }
  pdVar71 = (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
            m_data.array + 0x1d;
  uVar78 = -((uint)((ulong)pdVar71 >> 3) & 0x1fffffff) & 7;
  uVar81 = 0x19 - uVar78 & 0xfffffff8;
  uVar74 = (ulong)(uVar78 * 8);
  memcpy(pdVar71,local_1140,uVar74);
  memcpy((void *)((long)(__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                        m_storage.m_data.array + uVar74 + 0xe8),local_1140 + uVar74,
         (ulong)(uVar81 * 8 + 0xf8 & 0xc0) + 0x40);
  if ((uVar78 | uVar81) < 0x19) {
    uVar74 = (ulong)((0x19 - uVar78 & 0xfffffff8 | uVar78) << 3);
    memcpy((void *)((long)(__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                          m_storage.m_data.array + uVar74 + 0xe8),local_1140 + uVar74,
           200 - (ulong)((uVar81 | uVar78) << 3));
  }
  return;
}

Assistant:

void ShellANCF_Force::Evaluate(ChVectorN<double, 54>& result, const double x, const double y, const double z) {
    // Element shape function
    ChElementShellANCF_3423::ShapeVector N;
    m_element->ShapeFunctions(N, x, y, z);

    // Determinant of position vector gradient matrix: Initial configuration
    ChElementShellANCF_3423::ShapeVector Nx;
    ChElementShellANCF_3423::ShapeVector Ny;
    ChElementShellANCF_3423::ShapeVector Nz;
    ChMatrixNM<double, 1, 3> Nx_d0;
    ChMatrixNM<double, 1, 3> Ny_d0;
    ChMatrixNM<double, 1, 3> Nz_d0;
    double detJ0 = m_element->Calc_detJ0(x, y, z, Nx, Ny, Nz, Nx_d0, Ny_d0, Nz_d0);

    // ANS shape function
    ChMatrixNM<double, 1, 4> S_ANS;  // Shape function vector for Assumed Natural Strain
    ChMatrixNM<double, 6, 5> M;      // Shape function vector for Enhanced Assumed Strain
    m_element->ShapeFunctionANSbilinearShell(S_ANS, x, y);
    m_element->Basis_M(M, x, y, z);

    // Transformation : Orthogonal transformation (A and J)
    ChVector<double> G1xG2;  // Cross product of first and second column of
    double G1dotG1;          // Dot product of first column of position vector gradient

    G1xG2.x() = Nx_d0(1) * Ny_d0(2) - Nx_d0(2) * Ny_d0(1);
    G1xG2.y() = Nx_d0(2) * Ny_d0(0) - Nx_d0(0) * Ny_d0(2);
    G1xG2.z() = Nx_d0(0) * Ny_d0(1) - Nx_d0(1) * Ny_d0(0);
    G1dotG1 = Nx_d0(0) * Nx_d0(0) + Nx_d0(1) * Nx_d0(1) + Nx_d0(2) * Nx_d0(2);

    // Tangent Frame
    ChVector<double> A1;
    ChVector<double> A2;
    ChVector<double> A3;
    A1.x() = Nx_d0(0);
    A1.y() = Nx_d0(1);
    A1.z() = Nx_d0(2);
    A1 = A1 / sqrt(G1dotG1);
    A3 = G1xG2.GetNormalized();
    A2.Cross(A3, A1);

    // Direction for orthotropic material
    double theta = m_element->GetLayer(m_kl).Get_theta();  // Fiber angle
    ChVector<double> AA1;
    ChVector<double> AA2;
    ChVector<double> AA3;
    AA1 = A1 * cos(theta) + A2 * sin(theta);
    AA2 = -A1 * sin(theta) + A2 * cos(theta);
    AA3 = A3;

    /// Beta
    ChMatrixNM<double, 3, 3> j0;
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    ChVectorN<double, 9> beta;
    // Calculates inverse of rd0 (j0) (position vector gradient: Initial Configuration)
    j0(0, 0) = Ny_d0(1) * Nz_d0(2) - Nz_d0(1) * Ny_d0(2);
    j0(0, 1) = Ny_d0(2) * Nz_d0(0) - Ny_d0(0) * Nz_d0(2);
    j0(0, 2) = Ny_d0(0) * Nz_d0(1) - Nz_d0(0) * Ny_d0(1);
    j0(1, 0) = Nz_d0(1) * Nx_d0(2) - Nx_d0(1) * Nz_d0(2);
    j0(1, 1) = Nz_d0(2) * Nx_d0(0) - Nx_d0(2) * Nz_d0(0);
    j0(1, 2) = Nz_d0(0) * Nx_d0(1) - Nz_d0(1) * Nx_d0(0);
    j0(2, 0) = Nx_d0(1) * Ny_d0(2) - Ny_d0(1) * Nx_d0(2);
    j0(2, 1) = Ny_d0(0) * Nx_d0(2) - Nx_d0(0) * Ny_d0(2);
    j0(2, 2) = Nx_d0(0) * Ny_d0(1) - Ny_d0(0) * Nx_d0(1);
    j0 /= detJ0;

    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);

    // Coefficients of contravariant transformation
    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    // Transformation matrix, function of fiber angle
    const ChMatrixNM<double, 6, 6>& T0 = m_element->GetLayer(m_kl).Get_T0();
    // Determinant of the initial position vector gradient at the element center
    double detJ0C = m_element->GetLayer(m_kl).Get_detJ0C();

    // Enhanced Assumed Strain
    ChMatrixNM<double, 6, 5> G = T0 * M * (detJ0C / detJ0);
    ChVectorN<double, 6> strain_EAS = G * (*m_alpha_eas);

    ChVectorN<double, 8> ddNx = m_element->m_ddT * Nx.transpose();
    ChVectorN<double, 8> ddNy = m_element->m_ddT * Ny.transpose();

    ChVectorN<double, 8> d0d0Nx = m_element->m_d0d0T * Nx.transpose();
    ChVectorN<double, 8> d0d0Ny = m_element->m_d0d0T * Ny.transpose();

    // Strain component
    ChVectorN<double, 6> strain_til;
    strain_til(0) = 0.5 * ((Nx * ddNx)(0, 0) - (Nx * d0d0Nx)(0, 0));
    strain_til(1) = 0.5 * ((Ny * ddNy)(0, 0) - (Ny * d0d0Ny)(0, 0));
    strain_til(2) = (Nx * ddNy)(0, 0) - (Nx * d0d0Ny)(0, 0);
    strain_til(3) = N(0) * m_element->m_strainANS(0) + N(2) * m_element->m_strainANS(1) +
                    N(4) * m_element->m_strainANS(2) + N(6) * m_element->m_strainANS(3);
    strain_til(4) = S_ANS(0, 2) * m_element->m_strainANS(6) + S_ANS(0, 3) * m_element->m_strainANS(7);
    strain_til(5) = S_ANS(0, 0) * m_element->m_strainANS(4) + S_ANS(0, 1) * m_element->m_strainANS(5);

    // For orthotropic material
    ChVectorN<double, 6> strain;

    strain(0) = strain_til(0) * beta(0) * beta(0) + strain_til(1) * beta(3) * beta(3) +
                strain_til(2) * beta(0) * beta(3) + strain_til(3) * beta(6) * beta(6) +
                strain_til(4) * beta(0) * beta(6) + strain_til(5) * beta(3) * beta(6);
    strain(1) = strain_til(0) * beta(1) * beta(1) + strain_til(1) * beta(4) * beta(4) +
                strain_til(2) * beta(1) * beta(4) + strain_til(3) * beta(7) * beta(7) +
                strain_til(4) * beta(1) * beta(7) + strain_til(5) * beta(4) * beta(7);
    strain(2) = strain_til(0) * 2.0 * beta(0) * beta(1) + strain_til(1) * 2.0 * beta(3) * beta(4) +
                strain_til(2) * (beta(1) * beta(3) + beta(0) * beta(4)) + strain_til(3) * 2.0 * beta(6) * beta(7) +
                strain_til(4) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                strain_til(5) * (beta(4) * beta(6) + beta(3) * beta(7));
    strain(3) = strain_til(0) * beta(2) * beta(2) + strain_til(1) * beta(5) * beta(5) +
                strain_til(2) * beta(2) * beta(5) + strain_til(3) * beta(8) * beta(8) +
                strain_til(4) * beta(2) * beta(8) + strain_til(5) * beta(5) * beta(8);
    strain(4) = strain_til(0) * 2.0 * beta(0) * beta(2) + strain_til(1) * 2.0 * beta(3) * beta(5) +
                strain_til(2) * (beta(2) * beta(3) + beta(0) * beta(5)) + strain_til(3) * 2.0 * beta(6) * beta(8) +
                strain_til(4) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                strain_til(5) * (beta(5) * beta(6) + beta(3) * beta(8));
    strain(5) = strain_til(0) * 2.0 * beta(1) * beta(2) + strain_til(1) * 2.0 * beta(4) * beta(5) +
                strain_til(2) * (beta(2) * beta(4) + beta(1) * beta(5)) + strain_til(3) * 2.0 * beta(7) * beta(8) +
                strain_til(4) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                strain_til(5) * (beta(5) * beta(7) + beta(4) * beta(8));

    // Strain derivative component

    ChMatrixNM<double, 6, 24> strainD_til;

    ChMatrixNM<double, 1, 24> tempB;
    ChMatrixNM<double, 1, 3> tempB3;
    ChMatrixNM<double, 1, 3> tempB31;

    tempB3 = Nx * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Nx(0, i);
        }
    }
    strainD_til.row(0) = tempB;

    tempB3 = Ny * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Ny(0, i);
        }
    }
    strainD_til.row(1) = tempB;

    tempB31 = Nx * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Nx(0, i) + tempB31(0, j) * Ny(0, i);
        }
    }
    strainD_til.row(2) = tempB;

    tempB.setZero();
    for (int i = 0; i < 4; i++) {
        tempB += N(i * 2) * m_element->m_strainANS_D.row(i);
    }
    strainD_til.row(3) = tempB;  // strainD for zz

    tempB.setZero();
    for (int i = 0; i < 2; i++) {
        tempB += S_ANS(0, i + 2) * m_element->m_strainANS_D.row(i + 6);
    }
    strainD_til.row(4) = tempB;  // strainD for xz

    tempB.setZero();
    for (int i = 0; i < 2; i++) {
        tempB += S_ANS(0, i) * m_element->m_strainANS_D.row(i + 4);
    }
    strainD_til.row(5) = tempB;  // strainD for yz

    // For orthotropic material
    ChMatrixNM<double, 6, 24> strainD;  // Derivative of the strains w.r.t. the coordinates. Includes orthotropy
    for (int ii = 0; ii < 24; ii++) {
        strainD(0, ii) = strainD_til(0, ii) * beta(0) * beta(0) + strainD_til(1, ii) * beta(3) * beta(3) +
                         strainD_til(2, ii) * beta(0) * beta(3) + strainD_til(3, ii) * beta(6) * beta(6) +
                         strainD_til(4, ii) * beta(0) * beta(6) + strainD_til(5, ii) * beta(3) * beta(6);
        strainD(1, ii) = strainD_til(0, ii) * beta(1) * beta(1) + strainD_til(1, ii) * beta(4) * beta(4) +
                         strainD_til(2, ii) * beta(1) * beta(4) + strainD_til(3, ii) * beta(7) * beta(7) +
                         strainD_til(4, ii) * beta(1) * beta(7) + strainD_til(5, ii) * beta(4) * beta(7);
        strainD(2, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(1) + strainD_til(1, ii) * 2.0 * beta(3) * beta(4) +
                         strainD_til(2, ii) * (beta(1) * beta(3) + beta(0) * beta(4)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(7) +
                         strainD_til(4, ii) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                         strainD_til(5, ii) * (beta(4) * beta(6) + beta(3) * beta(7));
        strainD(3, ii) = strainD_til(0, ii) * beta(2) * beta(2) + strainD_til(1, ii) * beta(5) * beta(5) +
                         strainD_til(2, ii) * beta(2) * beta(5) + strainD_til(3, ii) * beta(8) * beta(8) +
                         strainD_til(4, ii) * beta(2) * beta(8) + strainD_til(5) * beta(5) * beta(8);
        strainD(4, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(2) + strainD_til(1, ii) * 2.0 * beta(3) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(3) + beta(0) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(6) + beta(3) * beta(8));
        strainD(5, ii) = strainD_til(0, ii) * 2.0 * beta(1) * beta(2) + strainD_til(1, ii) * 2.0 * beta(4) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(4) + beta(1) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(7) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(7) + beta(4) * beta(8));
    }

    // Enhanced Assumed Strain 2nd
    strain += strain_EAS;

    // Strain time derivative for structural damping
    ChVectorN<double, 6> DEPS;
    DEPS.setZero();
    for (int ii = 0; ii < 24; ii++) {
        DEPS(0) += strainD(0, ii) * m_element->m_d_dt(ii);
        DEPS(1) += strainD(1, ii) * m_element->m_d_dt(ii);
        DEPS(2) += strainD(2, ii) * m_element->m_d_dt(ii);
        DEPS(3) += strainD(3, ii) * m_element->m_d_dt(ii);
        DEPS(4) += strainD(4, ii) * m_element->m_d_dt(ii);
        DEPS(5) += strainD(5, ii) * m_element->m_d_dt(ii);
    }

    // Add structural damping
    strain += DEPS * m_element->m_Alpha;

    // Matrix of elastic coefficients: the input assumes the material *could* be orthotropic
    const ChMatrixNM<double, 6, 6>& E_eps = m_element->GetLayer(m_kl).GetMaterial()->Get_E_eps();

    // Internal force calculation
    ChVectorN<double, 24> Fint = (strainD.transpose() * E_eps * strain) * (detJ0 * m_element->m_GaussScaling);

    // EAS terms
    ChMatrixNM<double, 5, 6> temp56 = G.transpose() * E_eps;
    ChVectorN<double, 5> HE = (temp56 * strain) * (detJ0 * m_element->m_GaussScaling);     // EAS residual
    ChMatrixNM<double, 5, 5> KALPHA = (temp56 * G) * (detJ0 * m_element->m_GaussScaling);  // EAS Jacobian

    /// Total result vector
    result.segment(0, 24) = Fint;
    result.segment(24, 5) = HE;
    result.segment(29, 5 * 5) = Eigen::Map<ChVectorN<double, 5 * 5>>(KALPHA.data(), 5 * 5);
}